

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O1

void test_qlist_empty(void)

{
  QLIST_NODE node;
  QLIST list;
  long ***local_30;
  long ***local_28;
  long ***local_20;
  
  local_28 = (long ***)&local_28;
  local_20 = (long ***)&local_28;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x120,"%s","qlist_is_empty(&list)");
  local_30 = (long ***)&local_28;
  *local_20 = (long **)&local_30;
  local_20 = (long ***)&local_30;
  acutest_check_((uint)((long ****)local_28 != &local_28),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x122,"%s","!qlist_is_empty(&list)");
  return;
}

Assistant:

static void
test_qlist_empty(void)
{
    QLIST list;
    QLIST_NODE node;

    qlist_init(&list);

    TEST_CHECK(qlist_is_empty(&list));
    qlist_append(&list, &node);
    TEST_CHECK(!qlist_is_empty(&list));
}